

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
copyTo(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
       *this,OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
             *copy)

{
  int iVar1;
  vec<Glucose::vec<Glucose::Solver::Watcher>_> *in_RSI;
  vec<Glucose::vec<Glucose::Solver::Watcher>_> *in_RDI;
  int i;
  vec<Glucose::Solver::Watcher> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 local_14;
  
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::size(in_RDI);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo
            ((vec<Glucose::vec<Glucose::Solver::Watcher>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  local_14 = 0;
  while( true ) {
    iVar2 = local_14;
    iVar1 = vec<Glucose::vec<Glucose::Solver::Watcher>_>::size(in_RDI);
    if (iVar1 <= iVar2) break;
    in_stack_ffffffffffffffc8 =
         vec<Glucose::vec<Glucose::Solver::Watcher>_>::operator[](in_RDI,local_14);
    vec<Glucose::vec<Glucose::Solver::Watcher>_>::operator[](in_RSI,local_14);
    vec<Glucose::Solver::Watcher>::memCopyTo
              ((vec<Glucose::Solver::Watcher> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    local_14 = local_14 + 1;
  }
  vec<char>::memCopyTo
            ((vec<char> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
             (vec<char> *)in_stack_ffffffffffffffc8);
  vec<Glucose::Lit>::memCopyTo
            ((vec<Glucose::Lit> *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
             (vec<Glucose::Lit> *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void copyTo(OccLists &copy) const {
	
	copy.occs.growTo(occs.size());
	for(int i = 0;i<occs.size();i++)
	    occs[i].memCopyTo(copy.occs[i]);
	dirty.memCopyTo(copy.dirty);
	dirties.memCopyTo(copy.dirties);
    }